

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

char duckdb::DeltaDecode<signed_char>(char *data,char previous_value,size_t size)

{
  char cVar1;
  ulong uVar2;
  char cVar3;
  
  cVar3 = previous_value + *data;
  *data = cVar3;
  uVar2 = 1;
  if ((3 < size) && ((size & 0xfffffffffffffffc) != 4)) {
    do {
      cVar1 = data[uVar2];
      data[uVar2] = cVar3 + cVar1;
      cVar3 = cVar3 + cVar1 + data[uVar2 + 1];
      data[uVar2 + 1] = cVar3;
      cVar3 = cVar3 + data[uVar2 + 2];
      data[uVar2 + 2] = cVar3;
      cVar3 = cVar3 + data[uVar2 + 3];
      data[uVar2 + 3] = cVar3;
      uVar2 = uVar2 + 4;
    } while (uVar2 < (size & 0xfffffffffffffffc) - 4);
  }
  if (uVar2 != size) {
    cVar3 = data[uVar2 - 1];
    do {
      cVar3 = cVar3 + data[uVar2];
      data[uVar2] = cVar3;
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return (char)uVar2;
}

Assistant:

static T DeltaDecode(T *data, T previous_value, const size_t size) {
	D_ASSERT(size >= 1);

	data[0] += previous_value;

	const size_t UnrollQty = 4;
	const size_t sz0 = (size / UnrollQty) * UnrollQty; // equal to 0, if size < UnrollQty
	size_t i = 1;
	if (sz0 >= UnrollQty) {
		T a = data[0];
		for (; i < sz0 - UnrollQty; i += UnrollQty) {
			a = data[i] += a;
			a = data[i + 1] += a;
			a = data[i + 2] += a;
			a = data[i + 3] += a;
		}
	}
	for (; i != size; ++i) {
		data[i] += data[i - 1];
	}

	return data[size - 1];
}